

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

wchar_t pick_chest_traps(object *obj)

{
  uint32_t uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  wVar4 = obj->kind->level;
  uVar1 = Rand_div(10);
  if (uVar1 == 0) {
    wVar2 = L'\x01';
  }
  else {
    wVar2 = pick_one_chest_trap(wVar4);
    if (L'\x05' < wVar4) {
      uVar1 = Rand_div((0x41 - wVar4) / 10 + 1);
      if (uVar1 == 0) {
        wVar3 = pick_one_chest_trap(wVar4);
        wVar2 = wVar2 | wVar3;
      }
    }
    if (L'-' < wVar4) {
      uVar1 = Rand_div(0x41 - wVar4);
      if (uVar1 == 0) {
        wVar3 = pick_one_chest_trap(wVar4);
        wVar2 = wVar2 | wVar3;
        uVar1 = Rand_div(0x28);
        if (uVar1 == 0) {
          wVar4 = pick_one_chest_trap(wVar4);
          wVar2 = wVar2 | wVar4;
        }
      }
    }
  }
  return wVar2;
}

Assistant:

int pick_chest_traps(struct object *obj)
{
	int level = obj->kind->level;
	int trap = 0;

	/* One in ten chance of no trap */
	if (one_in_(10)) {
		return 1;
	}

	/* Pick a trap, add it */
	trap |= pick_one_chest_trap(level);

	/* Level dependent chance of a second trap (may overlap the first one) */
	if ((level > 5) && one_in_(1 + ((65 - level) / 10))) {
		trap |= pick_one_chest_trap(level);
	}

	/* Chance of a third trap for deep chests (may overlap existing traps) */
	if ((level > 45) && one_in_(65 - level)) {
		trap |= pick_one_chest_trap(level);
		/* Small chance of a fourth trap (may overlap existing traps) */
		if (one_in_(40)) {
			trap |= pick_one_chest_trap(level);
		}
	}

	return trap;
}